

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Division.h
# Opt level: O0

ptr<Value> __thiscall Division::asDoubles(Division *this,double leftOperand,double rightOperand)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<Value> pVar1;
  shared_ptr<Double> local_38;
  double local_28;
  double rightOperand_local;
  double leftOperand_local;
  Division *this_local;
  
  local_28 = rightOperand;
  rightOperand_local = leftOperand;
  this_local = this;
  make<Double,double>((double *)&local_38);
  std::shared_ptr<Value>::shared_ptr<Double,void>((shared_ptr<Value> *)this,&local_38);
  std::shared_ptr<Double>::~shared_ptr(&local_38);
  pVar1.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  pVar1.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Value>)pVar1.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Value> asDoubles(double leftOperand, double rightOperand) override {
        return make<Double>(leftOperand / rightOperand);
    }